

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O0

void __thiscall
boost::filesystem::filesystem_error::filesystem_error
          (filesystem_error *this,string *what_arg,path *path1_arg,path *path2_arg,error_code ec)

{
  m_imp *this_00;
  type pmVar1;
  error_code ec_00;
  path *path2_arg_local;
  path *path1_arg_local;
  string *what_arg_local;
  filesystem_error *this_local;
  error_code ec_local;
  
  ec_00._4_4_ = 0;
  ec_00.m_val = ec.m_val;
  ec_00.m_cat = ec.m_cat;
  system::system_error::system_error(&this->super_system_error,ec_00,what_arg);
  *(undefined ***)&this->super_system_error = &PTR__filesystem_error_00128928;
  shared_ptr<boost::filesystem::filesystem_error::m_imp>::shared_ptr(&this->m_imp_ptr);
  this_00 = (m_imp *)operator_new(0x60);
  m_imp::m_imp(this_00);
  shared_ptr<boost::filesystem::filesystem_error::m_imp>::
  reset<boost::filesystem::filesystem_error::m_imp>(&this->m_imp_ptr,this_00);
  pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
  filesystem::path::operator=(&pmVar1->m_path1,path1_arg);
  pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
  filesystem::path::operator=(&pmVar1->m_path2,path2_arg);
  return;
}

Assistant:

filesystem_error(
        const std::string & what_arg, const path& path1_arg,
        const path& path2_arg, system::error_code ec) BOOST_NOEXCEPT
        : system::system_error(ec, what_arg)
      {
        try
        {
          m_imp_ptr.reset(new m_imp);
          m_imp_ptr->m_path1 = path1_arg;
          m_imp_ptr->m_path2 = path2_arg;
        }
        catch (...) { m_imp_ptr.reset(); }
      }